

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O0

void __thiscall Limonp::Config::~Config(Config *this)

{
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x13121e);
  return;
}

Assistant:

bool loadFile(const char * const filePath)
            {
                ifstream ifs(filePath);
                if(!ifs)
                {
                    LogFatal("open file[%s] failed.", filePath);
                    return false;
                }
                string line;
                vector<string> vecBuf;
                uint lineno = 0;
                while(getline(ifs, line))
                {
                    lineno ++;
                    trim(line);
                    if(line.empty() || strStartsWith(line, "#"))
                    {
                        continue;
                    }
                    vecBuf.clear();
                    if(!splitStr(line, vecBuf, "=") || 2 != vecBuf.size())
                    {
                        LogFatal("line[%d:%s] is illegal.", lineno, line.c_str());
                        return false;
                    }
                    string& key = vecBuf[0];
                    string& value = vecBuf[1];
                    trim(key);
                    trim(value);
                    if(_map.end() != _map.find(key))
                    {
                        LogFatal("key[%s] already exists.", key.c_str());
                        return false;
                    }
                    _map[key] = value;
                }
                ifs.close();
                return true;
            }